

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O3

bool OverlapBoundedPlaneXYZHelper(double *a_bounded_plane,ON_RTreeBBox *a_rect)

{
  double dVar1;
  bool bVar2;
  byte bVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  dVar5 = a_rect->m_min[0] * *a_bounded_plane;
  dVar6 = a_rect->m_min[1] * a_bounded_plane[1];
  dVar7 = a_rect->m_min[2] * a_bounded_plane[2];
  dVar4 = a_bounded_plane[3];
  dVar8 = dVar5 + dVar6;
  dVar9 = dVar8 + dVar7 + dVar4;
  dVar1 = a_bounded_plane[4];
  bVar3 = 1;
  bVar2 = true;
  if (dVar1 <= dVar9) {
    bVar3 = 2;
    bVar2 = false;
    if (dVar9 < a_bounded_plane[5] || dVar9 == a_bounded_plane[5]) {
      return true;
    }
  }
  dVar9 = a_rect->m_max[0] * *a_bounded_plane;
  dVar6 = dVar6 + dVar9;
  dVar10 = dVar7 + dVar6 + dVar4;
  if (dVar1 <= dVar10) {
    if (bVar2) {
      return true;
    }
    bVar3 = 2;
    if (dVar10 < a_bounded_plane[5] || dVar10 == a_bounded_plane[5]) {
      return true;
    }
  }
  else {
    bVar3 = bVar3 | 1;
    if (bVar3 == 3) {
      return true;
    }
  }
  dVar10 = a_bounded_plane[1] * a_rect->m_max[1];
  dVar9 = dVar9 + dVar10;
  dVar11 = dVar7 + dVar9 + dVar4;
  if (dVar1 <= dVar11) {
    if ((bVar3 & 1) != 0) {
      return true;
    }
    bVar3 = 2;
    if (dVar11 < a_bounded_plane[5] || dVar11 == a_bounded_plane[5]) {
      return true;
    }
  }
  else {
    bVar3 = bVar3 | 1;
    if (bVar3 == 3) {
      return true;
    }
  }
  dVar11 = a_bounded_plane[2] * a_rect->m_max[2];
  dVar9 = dVar9 + dVar11 + dVar4;
  if (dVar1 <= dVar9) {
    if ((bVar3 & 1) != 0) {
      return true;
    }
    bVar3 = 2;
    if (dVar9 < a_bounded_plane[5] || dVar9 == a_bounded_plane[5]) {
      return true;
    }
  }
  else {
    bVar3 = bVar3 | 1;
    if (bVar3 == 3) {
      return true;
    }
  }
  dVar5 = dVar5 + dVar10;
  dVar9 = dVar5 + dVar11 + dVar4;
  if (dVar1 <= dVar9) {
    if ((bVar3 & 1) != 0) {
      return true;
    }
    bVar3 = 2;
    if (dVar9 < a_bounded_plane[5] || dVar9 == a_bounded_plane[5]) {
      return true;
    }
  }
  else {
    bVar3 = bVar3 | 1;
    if (bVar3 == 3) {
      return true;
    }
  }
  dVar8 = dVar8 + dVar11 + dVar4;
  if (dVar1 <= dVar8) {
    if ((bVar3 & 1) != 0) {
      return true;
    }
    bVar3 = 2;
    if (dVar8 < a_bounded_plane[5] || dVar8 == a_bounded_plane[5]) {
      return true;
    }
  }
  else {
    bVar3 = bVar3 | 1;
    if (bVar3 == 3) {
      return true;
    }
  }
  dVar6 = dVar6 + dVar11 + dVar4;
  if (dVar1 <= dVar6) {
    if ((bVar3 & 1) != 0) {
      return true;
    }
    bVar3 = 2;
    if (dVar6 < a_bounded_plane[5] || dVar6 == a_bounded_plane[5]) {
      return true;
    }
  }
  else {
    bVar3 = bVar3 | 1;
    if (bVar3 == 3) {
      return true;
    }
  }
  dVar4 = dVar4 + dVar7 + dVar5;
  if (dVar1 <= dVar4) {
    if (((bVar3 & 1) == 0) && (a_bounded_plane[5] <= dVar4 && dVar4 != a_bounded_plane[5])) {
      return false;
    }
  }
  else if ((bVar3 & 2) == 0) {
    return false;
  }
  return true;
}

Assistant:

static
bool OverlapBoundedPlaneXYZHelper( const double* a_bounded_plane, const ON_RTreeBBox* a_rect )
{
  unsigned char flag = 0;
  double x, y, z, d, v;
  
  // check the 8 corners of the box minimizing the number of evaluations
  // and unrolling the loop for speed

  // corner = (min, min, min)
  x = a_bounded_plane[0]*a_rect->m_min[0]; 
  y = a_bounded_plane[1]*a_rect->m_min[1];
  z = a_bounded_plane[2]*a_rect->m_min[2];
  d = a_bounded_plane[3];
  v = x + y + z + d;
  if ( v < a_bounded_plane[4] )
    flag = 1;
  else if ( v > a_bounded_plane[5] )
    flag = 2;
  else
    return true;
  
  // corner = (max, min, min)
  x = a_bounded_plane[0]*a_rect->m_max[0]; 
  v = x + y + z + d;
  if ( v < a_bounded_plane[4] )
  {
    flag |= 1;
    if ( 3 == flag )
      return true;
  }
  else if ( v > a_bounded_plane[5] )
  {
    flag |= 2;
    if ( 3 == flag )
      return true;
  }
  else
    return true;
  
  // corner = (max, max, min)
  y = a_bounded_plane[1]*a_rect->m_max[1];
  v = x + y + z + d;
  if ( v < a_bounded_plane[4] )
  {
    flag |= 1;
    if ( 3 == flag )
      return true;
  }
  else if ( v > a_bounded_plane[5] )
  {
    flag |= 2;
    if ( 3 == flag )
      return true;
  }
  else
    return true;
    
  // corner = (max, max, max)
  z = a_bounded_plane[2]*a_rect->m_max[2];
  v = x + y + z + d;
  if ( v < a_bounded_plane[4] )
  {
    flag |= 1;
    if ( 3 == flag )
      return true;
  }
  else if ( v > a_bounded_plane[5] )
  {
    flag |= 2;
    if ( 3 == flag )
      return true;
  }
  else
    return true;

  // corner = (min, max, max)
  x = a_bounded_plane[0]*a_rect->m_min[0]; 
  v = x + y + z + d;
  if ( v < a_bounded_plane[4] )
  {
    flag |= 1;
    if ( 3 == flag )
      return true;
  }
  else if ( v > a_bounded_plane[5] )
  {
    flag |= 2;
    if ( 3 == flag )
      return true;
  }
  else
    return true;
  
  // corner = (min, min, max)
  y = a_bounded_plane[1]*a_rect->m_min[1];
  v = x + y + z + d;
  if ( v < a_bounded_plane[4] )
  {
    flag |= 1;
    if ( 3 == flag )
      return true;
  }
  else if ( v > a_bounded_plane[5] )
  {
    flag |= 2;
    if ( 3 == flag )
      return true;
  }
  else
    return true;

  // corner = (max, min, max)
  x = a_bounded_plane[0]*a_rect->m_max[0]; 
  v = x + y + z + d;
  if ( v < a_bounded_plane[4] )
  {
    flag |= 1;
    if ( 3 == flag )
      return true;
  }
  else if ( v > a_bounded_plane[5] )
  {
    flag |= 2;
    if ( 3 == flag )
      return true;
  }
  else
    return true;

  // corner = (min, max, min)
  x = a_bounded_plane[0]*a_rect->m_min[0]; 
  y = a_bounded_plane[1]*a_rect->m_max[1];
  z = a_bounded_plane[2]*a_rect->m_min[2];
  v = x + y + z + d;
  if ( v < a_bounded_plane[4] )
  {
    flag |= 1;
    if ( 3 == flag )
      return true;
  }
  else if ( v > a_bounded_plane[5] )
  {
    flag |= 2;
    if ( 3 == flag )
      return true;
  }
  else
    return true;
  
  // Either all 8 box corners 
  // are below the min plane (flag=1)
  // or above the max plane (flag=2).
  return false;
}